

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  fe_loose *h;
  fe t0;
  fe trX;
  fe trT;
  fe trZ;
  fe_loose local_d0;
  fe local_a8;
  fe local_80;
  fe local_58;
  
  fe_sq_tt(&local_a8,&p->X);
  fe_sq_tt(&local_58,&p->Y);
  fe_sq_tt(&local_80,&p->Z);
  fe_add(&local_d0,&local_80,&local_80);
  fe_carry(&local_80,&local_d0);
  h = &r->Y;
  fe_add(h,&p->X,&p->Y);
  fe_sq_tl((fe *)&local_d0,h);
  fe_add(h,&local_58,&local_a8);
  fe_sub(&r->Z,&local_58,&local_a8);
  fe_carry(&local_58,h);
  fe_sub(&r->X,(fe *)&local_d0,&local_58);
  fe_carry(&local_58,&r->Z);
  fe_sub(&r->T,&local_80,&local_58);
  return;
}

Assistant:

static void ge_p2_dbl(ge_p1p1 *r, const ge_p2 *p) {
  fe trX, trZ, trT;
  fe t0;

  fe_sq_tt(&trX, &p->X);
  fe_sq_tt(&trZ, &p->Y);
  fe_sq2_tt(&trT, &p->Z);
  fe_add(&r->Y, &p->X, &p->Y);
  fe_sq_tl(&t0, &r->Y);

  fe_add(&r->Y, &trZ, &trX);
  fe_sub(&r->Z, &trZ, &trX);
  fe_carry(&trZ, &r->Y);
  fe_sub(&r->X, &t0, &trZ);
  fe_carry(&trZ, &r->Z);
  fe_sub(&r->T, &trT, &trZ);
}